

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

RegexPattern *
Js::JavascriptRegExp::CreatePattern(Var aValue,Var options,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t csz;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  charcount_t cszOpts;
  JavascriptString *pJVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RegexPattern *pRVar9;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  char16 *pszOpts;
  
  bVar3 = VarIs<Js::JavascriptString>(aValue);
  if (bVar3) {
    pJVar7 = VarTo<Js::JavascriptString>(aValue);
  }
  else {
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d04d70;
      *puVar8 = 0;
LAB_00d04be2:
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00d04d70;
        *puVar8 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) {
          pJVar7 = JavascriptLibrary::GetEmptyString
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          goto LAB_00d04cd0;
        }
      }
      else {
        BVar5 = RecyclableObject::IsExternal(this);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          fileName = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
          ;
          error = "(typeId < TypeIds_Limit || obj->IsExternal())";
          message = "GetTypeId aValue has invalid TypeId";
          lineNumber = 0xe;
          goto LAB_00d04cb0;
        }
      }
    }
    else if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
             ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)aValue >> 0x32 == 0 && ((ulong)aValue & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00d04be2;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
LAB_00d04cb0:
      bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
      if (!bVar3) {
LAB_00d04d70:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    pJVar7 = JavascriptConversion::ToString(aValue,scriptContext);
  }
LAB_00d04cd0:
  csz = JavascriptString::GetLength(pJVar7);
  iVar4 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar7);
  if (options != (Var)0x0) {
    BVar5 = JavascriptOperators::IsUndefinedObject(options);
    if (BVar5 == 0) {
      if ((ulong)options >> 0x30 == 0) {
        bVar3 = VarIsImpl<Js::JavascriptString>((RecyclableObject *)options);
        if (!bVar3) goto LAB_00d04d26;
        pJVar7 = VarTo<Js::JavascriptString>(options);
      }
      else {
LAB_00d04d26:
        pJVar7 = JavascriptConversion::ToString(options,scriptContext);
      }
      iVar6 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar7);
      pszOpts = (char16 *)CONCAT44(extraout_var_00,iVar6);
      cszOpts = JavascriptString::GetLength(pJVar7);
      goto LAB_00d04d4e;
    }
  }
  cszOpts = 0;
  pszOpts = (char16 *)0x0;
LAB_00d04d4e:
  pRVar9 = RegexHelper::CompileDynamic
                     (scriptContext,(char16 *)CONCAT44(extraout_var,iVar4),csz,pszOpts,cszOpts,false
                     );
  return pRVar9;
}

Assistant:

UnifiedRegex::RegexPattern* JavascriptRegExp::CreatePattern(Var aValue, Var options, ScriptContext *scriptContext)
    {
        JavascriptString * strBody;

        if (VarIs<JavascriptString>(aValue))
        {
            strBody = VarTo<JavascriptString>(aValue);
        }
        else if (JavascriptOperators::GetTypeId(aValue) == TypeIds_Undefined)
        {
            strBody = scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            strBody = JavascriptConversion::ToString(aValue, scriptContext); // must be null terminated!
        }

        int cBody = strBody->GetLength();
        const char16 *szRegex = strBody->GetSz();
        int cOpts = 0;
        const char16 *szOptions = nullptr;

        JavascriptString * strOptions = nullptr;
        if (options != nullptr && !JavascriptOperators::IsUndefinedObject(options))
        {
            if (VarIs<JavascriptString>(options))
            {
                strOptions = VarTo<JavascriptString>(options);
            }
            else
            {
                strOptions = JavascriptConversion::ToString(options, scriptContext);
            }

            szOptions = strOptions->GetSz(); // must be null terminated!
            cOpts = strOptions->GetLength();
        }

        UnifiedRegex::RegexPattern* pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);

        return pattern;
    }